

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIStaticText.cpp
# Opt level: O0

IGUIFont * __thiscall irr::gui::CGUIStaticText::getActiveFont(CGUIStaticText *this)

{
  long *plVar1;
  long in_RDI;
  IGUISkin *skin;
  undefined8 local_8;
  
  if (*(long *)(in_RDI + 0x150) == 0) {
    plVar1 = (long *)(**(code **)(**(long **)(in_RDI + 0x128) + 0x60))();
    if (plVar1 == (long *)0x0) {
      local_8 = (IGUIFont *)0x0;
    }
    else {
      local_8 = (IGUIFont *)(**(code **)(*plVar1 + 0x30))(plVar1,0);
    }
  }
  else {
    local_8 = *(IGUIFont **)(in_RDI + 0x150);
  }
  return local_8;
}

Assistant:

IGUIFont *CGUIStaticText::getActiveFont() const
{
	if (OverrideFont)
		return OverrideFont;
	IGUISkin *skin = Environment->getSkin();
	if (skin)
		return skin->getFont();
	return 0;
}